

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall
dtc::fdt::property::property
          (property *this,text_input_buffer *input,string *k,string_set *l,bool semicolonTerminated,
          define_map *defines)

{
  char cVar1;
  bool bVar2;
  unsigned_long_long local_118;
  unsigned_long_long bits;
  undefined1 local_f0 [8];
  property_value v;
  undefined1 local_88 [8];
  string filename;
  source_location loc;
  define_map *defines_local;
  bool semicolonTerminated_local;
  string_set *l_local;
  string *k_local;
  text_input_buffer *input_local;
  property *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)k);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->labels,l);
  std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::vector
            (&this->values);
  this->valid = true;
  do {
    text_input_buffer::next_token(input);
    cVar1 = text_input_buffer::operator*(input);
    switch(cVar1) {
    case '\"':
      parse_string(this,input);
      break;
    default:
switchD_0018147f_caseD_23:
      text_input_buffer::parse_error(input,"Invalid property value.");
      this->valid = false;
      return;
    case '$':
      parse_define(this,input,defines);
      if ((this->valid & 1U) == 0) goto switchD_0018147f_caseD_23;
      break;
    case '&':
      parse_reference(this,input);
      break;
    case '/':
      bVar2 = text_input_buffer::consume(input,"/incbin/(\"");
      if (bVar2) {
        text_input_buffer::location((source_location *)((long)&filename.field_2 + 8),input);
        text_input_buffer::parse_to_abi_cxx11_((string *)local_88,input,'\"');
        bVar2 = text_input_buffer::consume(input,'\"');
        this->valid = bVar2;
        if (bVar2) {
          std::__cxx11::string::string((string *)&bits);
          property_value::property_value((property_value *)local_f0,(string *)&bits);
          std::__cxx11::string::~string((string *)&bits);
          bVar2 = text_input_buffer::read_binary_file
                            (input,(string *)local_88,
                             (byte_buffer *)((long)&v.string_data.field_2 + 8));
          this->valid = bVar2;
          if (bVar2) {
            bVar2 = text_input_buffer::consume(input,')');
            bVar2 = (this->valid & 1U & bVar2) != 0;
            this->valid = bVar2;
            if (bVar2) {
              std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
              push_back(&this->values,(value_type *)local_f0);
              v._92_4_ = 4;
            }
            else {
              text_input_buffer::parse_error
                        (input,"Syntax error, expected \')\' to terminate /incbin/(");
              v._92_4_ = 1;
            }
          }
          else {
            text_input_buffer::parse_error(input,"Cannot open binary include file");
            v._92_4_ = 1;
          }
          property_value::~property_value((property_value *)local_f0);
        }
        else {
          text_input_buffer::source_location::report_error
                    ((source_location *)((long)&filename.field_2 + 8),
                     "Syntax error, expected \'\"\' to terminate /incbin/(");
          v._92_4_ = 1;
        }
        std::__cxx11::string::~string((string *)local_88);
        text_input_buffer::source_location::~source_location
                  ((source_location *)((long)&filename.field_2 + 8));
        if (v._92_4_ == 1) {
          return;
        }
      }
      else {
        local_118 = 0;
        bVar2 = text_input_buffer::consume(input,"/bits/");
        this->valid = bVar2;
        text_input_buffer::next_token(input);
        bVar2 = text_input_buffer::consume_integer(input,&local_118);
        this->valid = (this->valid & 1U & bVar2) != 0;
        if ((((local_118 != 8) && (local_118 != 0x10)) && (local_118 != 0x20)) &&
           (local_118 != 0x40)) {
          text_input_buffer::parse_error(input,"Invalid size for elements");
          this->valid = false;
        }
        if ((this->valid & 1U) == 0) {
          return;
        }
        text_input_buffer::next_token(input);
        cVar1 = text_input_buffer::operator*(input);
        if (cVar1 != '<') {
          text_input_buffer::parse_error(input,"/bits/ directive is only valid on arrays");
          this->valid = false;
          return;
        }
        parse_cells(this,input,(int)local_118);
      }
      break;
    case ';':
      break;
    case '<':
      parse_cells(this,input,0x20);
      break;
    case '[':
      parse_bytes(this,input);
    }
    text_input_buffer::next_token(input);
    bVar2 = text_input_buffer::consume(input,',');
    if (!bVar2) {
      if ((semicolonTerminated) && (bVar2 = text_input_buffer::consume(input,';'), !bVar2)) {
        text_input_buffer::parse_error(input,"Expected ; at end of property");
        this->valid = false;
      }
      return;
    }
  } while( true );
}

Assistant:

property::property(text_input_buffer &input,
                   string &&k,
                   string_set &&l,
                   bool semicolonTerminated,
                   define_map *defines) : key(k), labels(l), valid(true)
{
	do {
		input.next_token();
		switch (*input)
		{
			case '$':
			{
				parse_define(input, defines);
				if (valid)
				{
					break;
				}
			}
			[[fallthrough]];
			default:
				input.parse_error("Invalid property value.");
				valid = false;
				return;
			case '/':
			{
				if (input.consume("/incbin/(\""))
				{
					auto loc = input.location();
					std::string filename = input.parse_to('"');
					if (!(valid = input.consume('"')))
					{
						loc.report_error("Syntax error, expected '\"' to terminate /incbin/(");
						return;
					}
					property_value v;
					if (!(valid = input.read_binary_file(filename, v.byte_data)))
					{
						input.parse_error("Cannot open binary include file");
						return;
					}
					if (!(valid &= input.consume(')')))
					{
						input.parse_error("Syntax error, expected ')' to terminate /incbin/(");
						return;
					}
					values.push_back(v);
					break;
				}
				unsigned long long bits = 0;
				valid = input.consume("/bits/");
				input.next_token();
				valid &= input.consume_integer(bits);
				if ((bits != 8) &&
				    (bits != 16) &&
				    (bits != 32) &&
				    (bits != 64)) {
					input.parse_error("Invalid size for elements");
					valid = false;
				}
				if (!valid) return;
				input.next_token();
				if (*input != '<')
				{
					input.parse_error("/bits/ directive is only valid on arrays");
					valid = false;
					return;
				}
				parse_cells(input, bits);
				break;
			}
			case '"':
				parse_string(input);
				break;
			case '<':
				parse_cells(input, 32);
				break;
			case '[':
				parse_bytes(input);
				break;
			case '&':
				parse_reference(input);
				break;
			case ';':
			{
				break;
			}
		}
		input.next_token();
	} while (input.consume(','));
	if (semicolonTerminated && !input.consume(';'))
	{
		input.parse_error("Expected ; at end of property");
		valid = false;
	}
}